

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_optLdm_processMatchCandidate
               (ZSTD_optLdm_t *optLdm,ZSTD_match_t *matches,U32 *nbMatches,U32 currPosInBlock,
               U32 remainingBytes)

{
  uint uVar1;
  U32 UVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar3 = (optLdm->seqStore).size;
  if ((uVar3 != 0) && ((optLdm->seqStore).pos < uVar3)) {
    bVar5 = optLdm->endPosInBlock <= currPosInBlock;
    uVar4 = currPosInBlock - optLdm->endPosInBlock;
    if (bVar5) {
      if (bVar5 && uVar4 != 0) {
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,(ulong)uVar4);
      }
      ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm,currPosInBlock,remainingBytes);
    }
    if ((optLdm->startPosInBlock <= currPosInBlock) &&
       (uVar4 = optLdm->endPosInBlock - currPosInBlock,
       2 < uVar4 && (currPosInBlock <= optLdm->endPosInBlock && uVar4 != 0))) {
      uVar1 = *nbMatches;
      if (((ulong)uVar1 == 0) || ((uVar1 < 0x1000 && (matches[uVar1 - 1].len < uVar4)))) {
        UVar2 = optLdm->offset;
        matches[uVar1].len = uVar4;
        matches[*nbMatches].off = UVar2 + 3;
        *nbMatches = *nbMatches + 1;
      }
    }
  }
  return;
}

Assistant:

static void
ZSTD_optLdm_processMatchCandidate(ZSTD_optLdm_t* optLdm,
                                  ZSTD_match_t* matches, U32* nbMatches,
                                  U32 currPosInBlock, U32 remainingBytes)
{
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        return;
    }

    if (currPosInBlock >= optLdm->endPosInBlock) {
        if (currPosInBlock > optLdm->endPosInBlock) {
            /* The position at which ZSTD_optLdm_processMatchCandidate() is called is not necessarily
             * at the end of a match from the ldm seq store, and will often be some bytes
             * over beyond matchEndPosInBlock. As such, we need to correct for these "overshoots"
             */
            U32 const posOvershoot = currPosInBlock - optLdm->endPosInBlock;
            ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, posOvershoot);
        }
        ZSTD_opt_getNextMatchAndUpdateSeqStore(optLdm, currPosInBlock, remainingBytes);
    }
    ZSTD_optLdm_maybeAddMatch(matches, nbMatches, optLdm, currPosInBlock);
}